

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O0

void __thiscall
CTcMake::create_dir(CTcMake *this,CTcHostIfc *hostifc,char *path,int is_file,int *errcnt)

{
  int iVar1;
  size_t sVar2;
  int in_ECX;
  char *in_RDX;
  CTcHostIfc *in_RSI;
  int *in_R8;
  char dir [4096];
  char acStack_1028 [40];
  char *in_stack_fffffffffffff000;
  size_t in_stack_fffffffffffff008;
  char *in_stack_fffffffffffff010;
  char *local_18;
  
  local_18 = in_RDX;
  if (in_ECX != 0) {
    os_get_path_name(in_stack_fffffffffffff010,in_stack_fffffffffffff008,in_stack_fffffffffffff000);
    sVar2 = strlen(acStack_1028);
    local_18 = acStack_1028;
    if (sVar2 == 0) {
      return;
    }
  }
  iVar1 = access(local_18,0);
  if (iVar1 != 0) {
    CTcHostIfc::print_step(in_RSI,"creating output directory %s\n",local_18);
    iVar1 = os_mkdir((char *)dir._24_8_,dir._20_4_);
    if (iVar1 == 0) {
      CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_ERROR,0x2972,local_18);
      *in_R8 = *in_R8 + 1;
    }
  }
  return;
}

Assistant:

void CTcMake::create_dir(CTcHostIfc *hostifc,
                         const char *path, int is_file, int *errcnt)
{
    char dir[OSFNMAX];

    /*
     *   If the path includes a filename portion, remove it to get the parent
     *   directory path.
     */
    if (is_file)
    {
        /* extract the directory path portion */
        os_get_path_name(dir, sizeof(dir), path);
        path = dir;

        /* don't do anything if there's no path */
        if (strlen(dir) == 0)
            return;
    }

    /* if the directory doesn't already exist, create it */
    if (osfacc(path))
    {
        /* mention it */
        hostifc->print_step("creating output directory %s\n", path);
        
        /* try creating the folder */
        if (!os_mkdir(path, TRUE))
        {
            /* failed - log the error */
            G_tcmain->log_error(0, 0, TC_SEV_ERROR,
                                TCERR_CANNOT_CREATE_DIR, path);
            
            /* count it */
            *errcnt += 1;
        }
    }
}